

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QDate calculatePosixDate(QByteArray *dateRule,int year)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  int doy_1;
  int doy;
  int dow;
  int week;
  int month;
  QList<QByteArray> dateParts;
  bool ok;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  QList<QByteArray> *in_stack_ffffffffffffff10;
  QByteArrayView *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff48;
  char sep;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QList<QByteArray> local_30;
  byte local_11;
  qint64 local_10;
  long local_8;
  
  sep = (char)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = 0xaa;
  cVar2 = QByteArray::at((QByteArray *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                         ,0x750fa7);
  if (cVar2 == 'M') {
    local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((QByteArray *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      sep);
    qVar4 = QList<QByteArray>::size(&local_30);
    if (qVar4 < 3) {
LAB_00751196:
      bVar1 = false;
    }
    else {
      QList<QByteArray>::at
                (in_stack_ffffffffffffff10,
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      QByteArrayView::QByteArrayView<QByteArray,_true>
                ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QByteArray *)in_stack_ffffffffffffff18);
      QByteArrayView::sliced
                ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      QByteArrayView::toInt
                (in_stack_ffffffffffffff18,(bool *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff0c);
      if ((local_11 & 1) != 0) {
        QList<QByteArray>::at
                  (in_stack_ffffffffffffff10,
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        QByteArray::toInt((QByteArray *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          (bool *)in_stack_ffffffffffffff18,
                          (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      }
      if ((local_11 & 1) == 0) {
        iVar3 = 0;
      }
      else {
        QList<QByteArray>::at
                  (in_stack_ffffffffffffff10,
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        iVar3 = QByteArray::toInt((QByteArray *)
                                  CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                  (bool *)in_stack_ffffffffffffff18,
                                  (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      }
      if ((local_11 & 1) == 0) goto LAB_00751196;
      local_10 = (qint64)calculateDowDate(iVar3,in_stack_ffffffffffffff20,
                                          (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                          (int)in_stack_ffffffffffffff18);
      bVar1 = true;
    }
    QList<QByteArray>::~QList((QList<QByteArray> *)0x7511ab);
    if (bVar1) goto LAB_00751312;
  }
  else {
    cVar2 = QByteArray::at((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0x7511cd);
    if (cVar2 == 'J') {
      QByteArrayView::QByteArrayView<QByteArray,_true>
                ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QByteArray *)in_stack_ffffffffffffff18);
      QByteArrayView::sliced
                ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      iVar3 = QByteArrayView::toInt
                        (in_stack_ffffffffffffff18,(bool *)in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff0c);
      if ((((local_11 & 1) != 0) && (0 < iVar3)) && (iVar3 < 0x16e)) {
        QDate::isLeapYear(0);
        QDate::QDate((QDate *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
                     (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
        local_10 = (qint64)QDate::addDays((QDate *)in_stack_ffffffffffffff18,
                                          (qint64)in_stack_ffffffffffffff10);
        goto LAB_00751312;
      }
    }
    else {
      iVar3 = QByteArray::toInt((QByteArray *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                (bool *)in_stack_ffffffffffffff18,
                                (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      if ((((local_11 & 1) != 0) && (-1 < iVar3)) && (iVar3 < 0x16e)) {
        QDate::QDate((QDate *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
                     (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
        local_10 = (qint64)QDate::addDays((QDate *)in_stack_ffffffffffffff18,
                                          (qint64)in_stack_ffffffffffffff10);
        goto LAB_00751312;
      }
    }
  }
  QDate::QDate((QDate *)in_stack_ffffffffffffff10);
LAB_00751312:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDate)local_10;
}

Assistant:

static QDate calculatePosixDate(const QByteArray &dateRule, int year)
{
    Q_ASSERT(!dateRule.isEmpty());
    bool ok;
    // Can start with M, J, or a digit
    if (dateRule.at(0) == 'M') {
        // nth week in month format "Mmonth.week.dow"
        QList<QByteArray> dateParts = dateRule.split('.');
        if (dateParts.size() > 2) {
            Q_ASSERT(!dateParts.at(0).isEmpty()); // the 'M' is its [0].
            int month = QByteArrayView{ dateParts.at(0) }.sliced(1).toInt(&ok);
            int week = ok ? dateParts.at(1).toInt(&ok) : 0;
            int dow = ok ? dateParts.at(2).toInt(&ok) : 0;
            if (ok)
                return calculateDowDate(year, month, dow, week);
        }
    } else if (dateRule.at(0) == 'J') {
        // Day of Year 1...365, ignores Feb 29.
        // So March always starts on day 60.
        int doy = QByteArrayView{ dateRule }.sliced(1).toInt(&ok);
        if (ok && doy > 0 && doy < 366) {
            // Subtract 1 because we're adding days *after* the first of
            // January, unless it's after February in a leap year, when the leap
            // day cancels that out:
            if (!QDate::isLeapYear(year) || doy < 60)
                --doy;
            return QDate(year, 1, 1).addDays(doy);
        }
    } else {
        // Day of Year 0...365, includes Feb 29
        int doy = dateRule.toInt(&ok);
        if (ok && doy >= 0 && doy < 366)
            return QDate(year, 1, 1).addDays(doy);
    }
    return QDate();
}